

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldConvertorsTestCase.cpp
# Opt level: O2

void __thiscall
SuiteFieldConvertorsTests::TestutcTimeStampConvertToPrecisionBounds::RunImpl
          (TestutcTimeStampConvertToPrecisionBounds *this)

{
  TestResults *pTVar1;
  TestResults **ppTVar2;
  TestDetails **ppTVar3;
  int in_ECX;
  int precision;
  TestDetails *details;
  UtcTimeStamp input;
  string local_60;
  TestDetails local_40;
  UtcTimeStamp local_20;
  
  FIX::UtcTimeStamp::UtcTimeStamp(&local_20);
  local_20.super_DateTime.m_time = 0x2791a8ca0ee3;
  local_20.super_DateTime.m_date = 0x2568cd;
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  FIX::UtcTimeStampConvertor::convert_abi_cxx11_
            (&local_60,(UtcTimeStampConvertor *)&local_20,(UtcTimeStamp *)0xfffffc18,in_ECX);
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_40,*ppTVar3,0x117);
  details = &local_40;
  UnitTest::CheckEqual<char[18],std::__cxx11::string>
            (pTVar1,(char (*) [18])"20000426-12:05:06",&local_60,details);
  precision = (int)details;
  std::__cxx11::string::~string((string *)&local_60);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  FIX::UtcTimeStampConvertor::convert_abi_cxx11_
            (&local_60,(UtcTimeStampConvertor *)&local_20,(UtcTimeStamp *)0x3e8,precision);
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_40,*ppTVar3,0x118);
  UnitTest::CheckEqual<char[28],std::__cxx11::string>
            (pTVar1,(char (*) [28])"20000426-12:05:06.555555555",&local_60,&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  return;
}

Assistant:

TEST(utcTimeStampConvertToPrecisionBounds)
{
  UtcTimeStamp input;
  input.setHMS( 12, 5, 6, 555555555, 9 );
  input.setYMD( 2000, 4, 26 );
  CHECK_EQUAL( "20000426-12:05:06", UtcTimeStampConvertor::convert( input, -1000 ) );
  CHECK_EQUAL( "20000426-12:05:06.555555555", UtcTimeStampConvertor::convert( input, 1000 ) );
}